

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_write_utf8(mpack_writer_t *writer,char *str,uint32_t length)

{
  _Bool _Var1;
  
  _Var1 = mpack_utf8_check_impl((uint8_t *)str,(ulong)length,true);
  if (_Var1) {
    mpack_write_str(writer,str,length);
    return;
  }
  if (writer->error == mpack_ok) {
    writer->error = mpack_error_invalid;
    if (writer->error_fn != (mpack_writer_error_t)0x0) {
      (*writer->error_fn)(writer,mpack_error_invalid);
      return;
    }
  }
  return;
}

Assistant:

void mpack_write_utf8(mpack_writer_t* writer, const char* str, uint32_t length) {
    mpack_assert(str != NULL, "data for string of length %i is NULL", (int)length);
    if (!mpack_utf8_check(str, length)) {
        mpack_writer_flag_error(writer, mpack_error_invalid);
        return;
    }
    mpack_write_str(writer, str, length);
}